

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O1

void __thiscall wasm::StringLifting::run::StringApplier::~StringApplier(StringApplier *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>).
           super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
           super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                          ).
                                          super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>
                                          .
                                          super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }